

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

fio_str_info_s * fio_str2str(fio_str_info_s *__return_storage_ptr__,FIOBJ o)

{
  FIOBJ o_local;
  
  fiobj_str_get_cstr(__return_storage_ptr__,o);
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fio_str2str(const FIOBJ o) {
  return fiobj_str_get_cstr(o);
}